

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_matrix_zp_chain_rep.cpp
# Opt level: O0

void __thiscall
Chain_matrix_zp_rep_representative_cycles<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>
::test_method(Chain_matrix_zp_rep_representative_cycles<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>
              *this)

{
  undefined1 local_f8 [8];
  Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>
  m;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  Chain_matrix_zp_rep_representative_cycles<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>
  *this_local;
  
  build_longer_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>
  ::
  Matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>
              *)local_f8,
             (vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)&m.matrix_.colSettings_,5);
  test_representative_cycles<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>>
            ((Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>
              *)local_f8);
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>
  ::~Matrix((Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>
             *)local_f8);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&m.matrix_.colSettings_);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(Chain_matrix_zp_rep_representative_cycles, Matrix, full_matrices) {
  auto columns = build_longer_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);
  test_representative_cycles<Matrix>(m);
}